

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O3

void __thiscall KDReports::ImageElement::ImageElement(ImageElement *this,ImageElement *other)

{
  ImageElementPrivate *pIVar1;
  Data *pDVar2;
  undefined8 uVar3;
  qreal qVar4;
  bool bVar5;
  undefined3 uVar6;
  Unit UVar7;
  ImageElementPrivate *this_00;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ImageElement_00173328;
  this_00 = (ImageElementPrivate *)operator_new(0x58);
  pIVar1 = (other->d)._M_t.
           super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
           .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl;
  QVariant::QVariant((QVariant *)this_00,&pIVar1->m_pixmap);
  uVar3._0_4_ = (pIVar1->m_pixmapSize).wd;
  uVar3._4_4_ = (pIVar1->m_pixmapSize).ht;
  qVar4 = pIVar1->m_width;
  bVar5 = pIVar1->m_fitToPage;
  uVar6 = *(undefined3 *)&pIVar1->field_0x39;
  UVar7 = pIVar1->m_unit;
  this_00->m_height = pIVar1->m_height;
  this_00->m_fitToPage = bVar5;
  *(undefined3 *)&this_00->field_0x39 = uVar6;
  this_00->m_unit = UVar7;
  (this_00->m_pixmapSize).wd = (undefined4)uVar3;
  (this_00->m_pixmapSize).ht = (int)((ulong)uVar3 >> 0x20);
  this_00->m_width = qVar4;
  pDVar2 = (pIVar1->m_id).d.d;
  (this_00->m_id).d.d = pDVar2;
  *(char16_t **)((long)&(this_00->m_id).d + 8) = *(char16_t **)((long)&(pIVar1->m_id).d + 8);
  *(qsizetype *)((long)&(this_00->m_id).d + 0x10) = *(qsizetype *)((long)&(pIVar1->m_id).d + 0x10);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)&pDVar2->super_QArrayData = *(int *)&pDVar2->super_QArrayData + 1;
    UNLOCK();
  }
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
  .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::ImageElement::ImageElement(const ImageElement &other)
    : Element(other)
    , d(new ImageElementPrivate(*other.d))
{
}